

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t le;
  uint32_t run_start;
  int i;
  int32_t pos;
  array_container_t *container2_local;
  run_container_t *container1_local;
  
  iVar1 = run_container_cardinality(container1);
  if (iVar1 == container2->cardinality) {
    run_start = 0;
    for (le = 0; (int)le < container1->n_runs; le = le + 1) {
      uVar2 = (uint)container1->runs[(int)le].value;
      uVar3 = (uint)container1->runs[(int)le].length;
      if (container2->array[(int)run_start] != uVar2) {
        return false;
      }
      if ((uint)container2->array[run_start + uVar3] != uVar2 + uVar3) {
        return false;
      }
      run_start = uVar3 + 1 + run_start;
    }
    container1_local._7_1_ = true;
  }
  else {
    container1_local._7_1_ = false;
  }
  return container1_local._7_1_;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}